

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

void icetStateSetDefaults(void)

{
  IceTTimeStamp IVar1;
  uint num_entries;
  int iVar2;
  IceTState pIVar3;
  IceTVoid *pIVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 local_20;
  
  icetDiagnostics(0x103);
  num_entries = icetCommSize();
  iVar2 = icetCommRank();
  local_20._0_4_ = iVar2;
  stateSet(2,1,0x8003,&local_20);
  local_20._0_4_ = num_entries;
  stateSet(3,1,0x8003,&local_20);
  stateSet(5,4,0x8004,black);
  local_20._0_4_ = 0;
  stateSet(6,1,0x8003,&local_20);
  local_20._0_4_ = 0xc001;
  stateSet(9,1,0x8003,&local_20);
  local_20._0_4_ = 0xd001;
  stateSet(10,1,0x8003,&local_20);
  icetResetTiles();
  icetTypeWidth(0x8003);
  pIVar3 = icetGetState();
  if ((pIVar3[0x1a].num_entries != 0) || (pIVar3[0x1a].type != 0x8003)) {
    pIVar3[0x1a].type = 0x8003;
    pIVar3[0x1a].num_entries = 0;
    pIVar3[0x1a].data = (void *)0x0;
  }
  IVar1 = icetGetTimeStamp::current_time + 1;
  pIVar3[0x1a].mod_time = icetGetTimeStamp::current_time;
  icetGetTimeStamp::current_time = IVar1;
  icetTypeWidth(0x8005);
  pIVar3 = icetGetState();
  if ((pIVar3[0x22].num_entries != 0) || (pIVar3[0x22].type != 0x8005)) {
    pIVar3[0x22].type = 0x8005;
    pIVar3[0x22].num_entries = 0;
    pIVar3[0x22].data = (void *)0x0;
  }
  IVar1 = icetGetTimeStamp::current_time + 1;
  pIVar3[0x22].mod_time = icetGetTimeStamp::current_time;
  icetGetTimeStamp::current_time = IVar1;
  local_20._0_4_ = 0;
  stateSet(0x23,1,0x8003,&local_20);
  local_20._0_4_ = 0xffffffff;
  stateSet(0x24,1,0x8003,&local_20);
  icetSingleImageStrategy(0x7001);
  icetCompositeMode(0x301);
  pIVar3 = icetGetState();
  pIVar4 = stateAllocate(0x29,num_entries,0x8003,pIVar3);
  if (0 < (int)num_entries) {
    uVar6 = 0;
    do {
      *(int *)((long)pIVar4 + uVar6 * 4) = (int)uVar6;
      uVar6 = uVar6 + 1;
    } while (num_entries != uVar6);
  }
  pIVar3 = icetGetState();
  pIVar4 = stateAllocate(0x2a,num_entries,0x8003,pIVar3);
  if (0 < (int)num_entries) {
    uVar6 = 0;
    do {
      *(int *)((long)pIVar4 + uVar6 * 4) = (int)uVar6;
      uVar6 = uVar6 + 1;
    } while (num_entries != uVar6);
  }
  local_20._0_4_ = iVar2;
  stateSet(0x2c,1,0x8003,&local_20);
  local_20._0_4_ = 1;
  stateSet(0x2d,1,0x8003,&local_20);
  local_20._0_4_ = 0;
  stateSet(0x2e,1,0x8003,&local_20);
  pcVar5 = getenv("ICET_MAGIC_K");
  if (pcVar5 == (char *)0x0) {
LAB_00109e7b:
    local_20._0_4_ = 8;
    iVar2 = (uint)local_20;
  }
  else {
    iVar2 = atoi(pcVar5);
    if (iVar2 < 2) {
      icetRaiseDiagnostic("Environment varible ICET_MAGIC_K must be set to an integer greater than 1."
                          ,0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                          ,0xa6);
      goto LAB_00109e7b;
    }
  }
  local_20._0_4_ = iVar2;
  stateSet(0x40,1,0x8003,&local_20);
  pcVar5 = getenv("ICET_MAX_IMAGE_SPLIT");
  if (pcVar5 != (char *)0x0) {
    iVar2 = atoi(pcVar5);
    if (0 < iVar2) {
      local_20 = CONCAT44(local_20._4_4_,iVar2);
      goto LAB_00109eee;
    }
    icetRaiseDiagnostic("Environment variable ICET_MAX_IMAGE_SPLIT must be set to an integer greater than 0."
                        ,0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0xb4);
  }
  local_20 = CONCAT44(local_20._4_4_,0x200);
LAB_00109eee:
  stateSet(0x41,1,0x8003,&local_20);
  local_20 = 0;
  stateSet(0x60,1,0x8008,&local_20);
  local_20 = 0;
  stateSet(0x61,1,0x8008,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x141,1,0x8000,&local_20);
  local_20._0_1_ = 0;
  stateSet(0x142,1,0x8000,&local_20);
  local_20._0_1_ = 0;
  stateSet(0x143,1,0x8000,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x144,1,0x8000,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x145,1,0x8000,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x146,1,0x8000,&local_20);
  local_20._0_1_ = 0;
  stateSet(0x80,1,0x8000,&local_20);
  local_20 = (ulong)local_20._1_7_ << 8;
  stateSet(0x92,1,0x8000,&local_20);
  local_20._0_4_ = 0xffffffff;
  stateSet(0x8c,1,0x8003,&local_20);
  local_20._0_4_ = 0;
  stateSet(0x8d,1,0x8003,&local_20);
  local_20 = (ulong)local_20._4_4_ << 0x20;
  stateSet(0x8e,1,0x8003,&local_20);
  icetStateResetTiming();
  return;
}

Assistant:

void icetStateSetDefaults(void)
{
    IceTInt *int_array;
    int i;
    int comm_size, comm_rank;

    icetDiagnostics(ICET_DIAG_ALL_NODES | ICET_DIAG_WARNINGS);

    comm_size = icetCommSize();
    comm_rank = icetCommRank();
    icetStateSetInteger(ICET_RANK, comm_rank);
    icetStateSetInteger(ICET_NUM_PROCESSES, comm_size);
    /* icetStateSetInteger(ICET_ABSOLUTE_FAR_DEPTH, 1); */
  /*icetStateSetInteger(ICET_ABSOLUTE_FAR_DEPTH, 0xFFFFFFFF);*/
    icetStateSetFloatv(ICET_BACKGROUND_COLOR, 4, black);
    icetStateSetInteger(ICET_BACKGROUND_COLOR_WORD, 0);
    icetStateSetInteger(ICET_COLOR_FORMAT, ICET_IMAGE_COLOR_RGBA_UBYTE);
    icetStateSetInteger(ICET_DEPTH_FORMAT, ICET_IMAGE_DEPTH_FLOAT);

    icetResetTiles();
    icetStateSetIntegerv(ICET_DISPLAY_NODES, 0, NULL);

    icetStateSetDoublev(ICET_GEOMETRY_BOUNDS, 0, NULL);
    icetStateSetInteger(ICET_NUM_BOUNDING_VERTS, 0);
    icetStateSetInteger(ICET_STRATEGY, ICET_STRATEGY_UNDEFINED);
    icetSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC);
    icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
    int_array = icetStateAllocateInteger(ICET_COMPOSITE_ORDER, comm_size);
    for (i = 0; i < comm_size; i++) {
        int_array[i] = i;
    }
    int_array = icetStateAllocateInteger(ICET_PROCESS_ORDERS, comm_size);
    for (i = 0; i < comm_size; i++) {
        int_array[i] = i;
    }

    icetStateSetInteger(ICET_DATA_REPLICATION_GROUP, comm_rank);
    icetStateSetInteger(ICET_DATA_REPLICATION_GROUP_SIZE, 1);
    icetStateSetInteger(ICET_FRAME_COUNT, 0);

    if (getenv("ICET_MAGIC_K") != NULL) {
        IceTInt magic_k = atoi(getenv("ICET_MAGIC_K"));
        if (magic_k > 1) {
            icetStateSetInteger(ICET_MAGIC_K, magic_k);
        } else {
            icetRaiseError("Environment varible ICET_MAGIC_K must be set"
                           " to an integer greater than 1.",
                           ICET_INVALID_VALUE);
            icetStateSetInteger(ICET_MAGIC_K, ICET_MAGIC_K_DEFAULT);
        }
    } else {
        icetStateSetInteger(ICET_MAGIC_K, ICET_MAGIC_K_DEFAULT);
    }

    if (getenv("ICET_MAX_IMAGE_SPLIT") != NULL) {
        IceTInt max_image_split = atoi(getenv("ICET_MAX_IMAGE_SPLIT"));
        if (max_image_split > 0) {
            icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, max_image_split);
        } else {
            icetRaiseError("Environment variable ICET_MAX_IMAGE_SPLIT must be"
                           " set to an integer greater than 0.",
                           ICET_INVALID_VALUE);
            icetStateSetInteger(ICET_MAX_IMAGE_SPLIT,
                                ICET_MAX_IMAGE_SPLIT_DEFAULT);
        }
    } else {
        icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, ICET_MAX_IMAGE_SPLIT_DEFAULT);
    }

    icetStateSetPointer(ICET_DRAW_FUNCTION, NULL);
    icetStateSetPointer(ICET_RENDER_LAYER_DESTRUCTOR, NULL);

    icetEnable(ICET_FLOATING_VIEWPORT);
    icetDisable(ICET_ORDERED_COMPOSITE);
    icetDisable(ICET_CORRECT_COLORED_BACKGROUND);
    icetEnable(ICET_COMPOSITE_ONE_BUFFER);
    icetEnable(ICET_INTERLACE_IMAGES);
    icetEnable(ICET_COLLECT_IMAGES);

    icetStateSetBoolean(ICET_IS_DRAWING_FRAME, 0);
    icetStateSetBoolean(ICET_RENDER_BUFFER_SIZE, 0);

    icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
    icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
    icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);

    icetStateResetTiming();
}